

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::color3h>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *result)

{
  pointer *ppcVar1;
  pointer pcVar2;
  iterator iVar3;
  StreamReader *pSVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  color3h value;
  color3h value_1;
  color3h local_56;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pcVar2 = (result->
           super__Vector_base<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((result->
      super__Vector_base<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>).
      _M_impl.super__Vector_impl_data._M_finish != pcVar2) {
    (result->super__Vector_base<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
    )._M_impl.super__Vector_impl_data._M_finish = pcVar2;
  }
  bVar6 = SkipWhitespaceAndNewline(this,true);
  if (bVar6) {
    bVar6 = ReadBasicType(this,&local_56);
    if (bVar6) {
      iVar3._M_current =
           (result->
           super__Vector_base<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (result->
          super__Vector_base<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<tinyusdz::value::color3h,std::allocator<tinyusdz::value::color3h>>::
        _M_realloc_insert<tinyusdz::value::color3h_const&>
                  ((vector<tinyusdz::value::color3h,std::allocator<tinyusdz::value::color3h>> *)
                   result,iVar3,&local_56);
      }
      else {
        ((iVar3._M_current)->b).value = local_56.b.value;
        (iVar3._M_current)->r = (half)local_56.r.value;
        (iVar3._M_current)->g = (half)local_56.g.value;
        ppcVar1 = &(result->
                   super__Vector_base<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppcVar1 = *ppcVar1 + 1;
      }
      do {
        pSVar4 = this->_sr;
        if ((pSVar4->length_ <= pSVar4->idx_) || (pSVar4->binary_[pSVar4->idx_] == '\0'))
        goto LAB_0037c94c;
        bVar6 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar6) {
          return false;
        }
        bVar6 = Char1(this,(char *)&local_56);
        if (!bVar6) {
          return false;
        }
        if ((char)local_56.r.value == sep) {
          bVar6 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar6) {
            return false;
          }
          bVar6 = LookChar1(this,(char *)local_50);
          if (!bVar6) {
            return false;
          }
          iVar7 = 3;
          if (local_50[0] != end_symbol) {
            goto LAB_0037c8c5;
          }
        }
        else {
LAB_0037c8c5:
          if ((char)local_56.r.value != sep) {
            pSVar4 = this->_sr;
            if ((0 < (long)pSVar4->idx_) && (uVar8 = pSVar4->idx_ - 1, uVar8 <= pSVar4->length_)) {
              pSVar4->idx_ = uVar8;
            }
            goto LAB_0037c94c;
          }
          bVar6 = SkipWhitespaceAndNewline(this,true);
          if (!bVar6) {
            return false;
          }
          bVar6 = ReadBasicType(this,(color3h *)local_50);
          uVar5 = local_50._0_8_;
          iVar7 = 3;
          if (bVar6) {
            iVar3._M_current =
                 (result->
                 super__Vector_base<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (result->
                super__Vector_base<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<tinyusdz::value::color3h,std::allocator<tinyusdz::value::color3h>>::
              _M_realloc_insert<tinyusdz::value::color3h_const&>
                        ((vector<tinyusdz::value::color3h,std::allocator<tinyusdz::value::color3h>>
                          *)result,iVar3,(color3h *)local_50);
            }
            else {
              ((iVar3._M_current)->b).value = local_50._4_2_;
              (iVar3._M_current)->r = (half)local_50._0_2_;
              (iVar3._M_current)->g = (half)local_50._2_2_;
              ppcVar1 = &(result->
                         super__Vector_base<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppcVar1 = *ppcVar1 + 1;
              local_50._0_8_ = uVar5;
            }
            iVar7 = 0;
          }
        }
      } while (iVar7 == 0);
      if (iVar7 == 1) {
        return false;
      }
LAB_0037c94c:
      if ((result->
          super__Vector_base<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>).
          _M_impl.super__Vector_impl_data._M_start !=
          (result->
          super__Vector_base<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>).
          _M_impl.super__Vector_impl_data._M_finish) {
        return true;
      }
      pcVar10 = "Empty array.\n";
      pcVar9 = "";
    }
    else {
      pcVar10 = "Not starting with the value of requested type.\n";
      pcVar9 = "";
    }
    local_50._0_8_ = &local_40;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar10,pcVar9);
    PushError(this,(string *)local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._0_8_ != &local_40) {
      operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}